

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*,_const_char_*,_int>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const*&,char_const*&,int&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*,_const_char_*,_int>
           *__return_storage_ptr__,v8 *this,char **args,char **args_1,int *args_2)

{
  char *pcVar1;
  char_type **arg_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  int *arg_2;
  size_t local_120;
  size_t local_f0;
  longlong local_88;
  size_t local_80;
  int *args_local_2;
  char **args_local_1;
  char **args_local;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  
  pcVar1 = *args;
  local_88._0_4_ = *(undefined4 *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_f0;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = pcVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_120;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_88;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_80;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}